

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_Respawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  TObjPtr<AActor> *pTVar1;
  byte *pbVar2;
  uint uVar3;
  AActor *this;
  PClass *pPVar4;
  BYTE *pBVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AActor *pAVar8;
  undefined4 in_register_00000014;
  undefined8 uVar9;
  undefined8 extraout_RDX;
  TArray<VMValue,_VMValue> *pTVar10;
  char *pcVar11;
  bool bVar12;
  DVector3 pos;
  DVector3 local_58;
  DVector3 local_40;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar9 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      pTVar10 = defaultparam;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
          uVar9 = extraout_RDX;
        }
        pPVar7 = (this->super_DThinker).super_DObject.Class;
        bVar12 = pPVar7 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar12);
        uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),bVar12);
        pTVar10 = (TArray<VMValue,_VMValue> *)
                  CONCAT71((int7)((ulong)pTVar10 >> 8),pPVar7 == pPVar4 || bVar12);
        if (pPVar7 != pPVar4 && !bVar12) {
          do {
            pPVar7 = pPVar7->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar7 != (PClass *)0x0);
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d5bab;
        }
      }
      if (numparam == 1) {
        param = defaultparam->Array;
        if (param[1].field_0.field_3.Type == '\0') {
LAB_003d58f2:
          uVar3 = param[1].field_0.i;
          local_58.X = (this->__Pos).X;
          local_58.Y = (this->__Pos).Y;
          local_58.Z = (this->__Pos).Z;
          *(byte *)&(this->flags).Value = (byte)(this->flags).Value | 2;
          if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this,pTVar10,uVar9,ret);
            (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar6);
          }
          pPVar4 = (this->super_DThinker).super_DObject.Class;
          this->Height = *(double *)(pPVar4->Defaults + 0x180);
          if (pPVar4 == (PClass *)0x0) {
            iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
            (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar6);
          }
          this->radius = *(double *)(((this->super_DThinker).super_DObject.Class)->Defaults + 0x178)
          ;
          AActor::RestoreSpecialPosition(this);
          if ((uVar3 & 4) == 0) {
            local_40.X = (this->__Pos).X;
            local_40.Y = (this->__Pos).Y;
            bVar12 = P_CheckPosition(this,(DVector2 *)&local_40,true);
          }
          else {
            local_40.X = (this->__Pos).X;
            local_40.Y = (this->__Pos).Y;
            local_40.Z = (this->__Pos).Z;
            bVar12 = P_TeleportMove(this,&local_40,true,false);
          }
          if (bVar12 == false) {
            *(byte *)&(this->flags).Value = (byte)(this->flags).Value & 0xfd;
          }
          else {
            if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
              (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar6)
              ;
            }
            pBVar5 = ((this->super_DThinker).super_DObject.Class)->Defaults;
            this->health = *(int *)(pBVar5 + 0x1fc);
            pTVar1 = &this->target;
            if ((uVar3 & 2) == 0) {
              (pTVar1->field_0).p = (AActor *)0x0;
              (this->lastenemy).field_0.p = (AActor *)0x0;
              (this->LastHeard).field_0.p = (AActor *)0x0;
            }
            else {
              pAVar8 = (pTVar1->field_0).p;
              if ((pAVar8 != (AActor *)0x0) &&
                 (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (pTVar1->field_0).p = (AActor *)0x0;
                pAVar8 = (AActor *)0x0;
              }
              if (pAVar8 == this) {
                (pTVar1->field_0).p = (AActor *)0x0;
              }
              pAVar8 = (this->lastenemy).field_0.p;
              if ((pAVar8 != (AActor *)0x0) &&
                 (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (this->lastenemy).field_0.p = (AActor *)0x0;
                pAVar8 = (AActor *)0x0;
              }
              if (pAVar8 == this) {
                (this->lastenemy).field_0.p = (AActor *)0x0;
              }
            }
            (this->flags).Value =
                 (this->flags).Value & 0x8000000 | *(uint *)(pBVar5 + 0x1bc) & 0xf7ffffff;
            (this->flags2).Value = *(uint *)(pBVar5 + 0x1c0);
            (this->flags3).Value =
                 (this->flags3).Value & 0x80000080 | *(uint *)(pBVar5 + 0x1c4) & 0x7fffff7f;
            (this->flags4).Value = (this->flags4).Value & 1 | *(uint *)(pBVar5 + 0x1c8) & 0xfffffffe
            ;
            (this->flags5).Value = *(uint *)(pBVar5 + 0x1cc);
            (this->flags6).Value = *(uint *)(pBVar5 + 0x1d0);
            (this->flags7).Value = *(uint *)(pBVar5 + 0x1d4);
            AActor::SetState(this,this->SpawnState,false);
            pbVar2 = (byte *)((long)&(this->renderflags).Value + 1);
            *pbVar2 = *pbVar2 & 0x7f;
            if ((uVar3 & 1) != 0) {
              P_SpawnTeleportFog(this,&local_58,true,true);
              local_40.X = (this->__Pos).X;
              local_40.Y = (this->__Pos).Y;
              local_40.Z = (this->__Pos).Z;
              P_SpawnTeleportFog(this,&local_40,false,true);
            }
            if (((this->flags).Value & 0x8400000) == 0x400000) {
              level.total_monsters = level.total_monsters + 1;
            }
          }
          return 0;
        }
        pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') goto LAB_003d58f2;
        pcVar11 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xef4,
                    "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d5bab:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xef3,"int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Respawn)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);

	bool oktorespawn = false;
	DVector3 pos = self->Pos();

	self->flags |= MF_SOLID;
	self->Height = self->GetDefault()->Height;
	self->radius = self->GetDefault()->radius;
	self->RestoreSpecialPosition();

	if (flags & RSF_TELEFRAG)
	{
		// [KS] DIE DIE DIE DIE erm *ahem* =)
		oktorespawn = P_TeleportMove(self, self->Pos(), true, false);
	}
	else
	{
		oktorespawn = P_CheckPosition(self, self->Pos(), true);
	}

	if (oktorespawn)
	{
		AActor *defs = self->GetDefault();
		self->health = defs->health;

		// [KS] Don't keep target, because it could be self if the monster committed suicide
		//      ...Actually it's better off an option, so you have better control over monster behavior.
		if (!(flags & RSF_KEEPTARGET))
		{
			self->target = NULL;
			self->LastHeard = NULL;
			self->lastenemy = NULL;
		}
		else
		{
			// Don't attack yourself (Re: "Marine targets itself after suicide")
			if (self->target == self)
				self->target = NULL;
			if (self->lastenemy == self)
				self->lastenemy = NULL;
		}

		self->flags  = (defs->flags & ~MF_FRIENDLY) | (self->flags & MF_FRIENDLY);
		self->flags2 = defs->flags2;
		self->flags3 = (defs->flags3 & ~(MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS)) | (self->flags3 & (MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS));
		self->flags4 = (defs->flags4 & ~MF4_NOHATEPLAYERS) | (self->flags4 & MF4_NOHATEPLAYERS);
		self->flags5 = defs->flags5;
		self->flags6 = defs->flags6;
		self->flags7 = defs->flags7;
		self->SetState (self->SpawnState);
		self->renderflags &= ~RF_INVISIBLE;

		if (flags & RSF_FOG)
		{
			P_SpawnTeleportFog(self, pos, true, true);
			P_SpawnTeleportFog(self, self->Pos(), false, true);
		}
		if (self->CountsAsKill())
		{
			level.total_monsters++;
		}
	}
	else
	{
		self->flags &= ~MF_SOLID;
	}
	return 0;
}